

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

IceTBoolean icetIsEnabled(IceTEnum pname)

{
  IceTBoolean local_11;
  IceTEnum local_10;
  IceTBoolean isEnabled;
  IceTEnum pname_local;
  
  local_10 = pname;
  if ((pname < 0x140) || (0x17f < pname)) {
    icetRaiseDiagnostic("Bad value to icetIsEnabled",0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/state.c"
                        ,0x1a3);
    isEnabled = '\0';
  }
  else {
    icetGetBooleanv(pname,&local_11);
    isEnabled = local_11;
  }
  return isEnabled;
}

Assistant:

IceTBoolean icetIsEnabled(IceTEnum pname)
{
    IceTBoolean isEnabled;

    if ((pname < ICET_STATE_ENABLE_START) || (pname >= ICET_STATE_ENABLE_END)) {
        icetRaiseError("Bad value to icetIsEnabled", ICET_INVALID_VALUE);
        return ICET_FALSE;
    }
    icetGetBooleanv(pname, &isEnabled);
    return isEnabled;
}